

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O2

void __thiscall
rengine::AllocationPool<rengine::OpacityNode>::deallocate
          (AllocationPool<rengine::OpacityNode> *this,OpacityNode *t)

{
  uint uVar1;
  long lVar2;
  char *__assertion;
  uint uVar3;
  
  if (this->m_memory == (OpacityNode *)0x0) {
    __assertion = "m_memory";
    uVar1 = 0x52;
  }
  else if (this->m_free == (uint *)0x0) {
    __assertion = "m_free";
    uVar1 = 0x53;
  }
  else if (this->m_nextFree == 0) {
    __assertion = "m_nextFree > 0";
    uVar1 = 0x54;
  }
  else {
    lVar2 = (long)t - (long)this->m_memory;
    uVar1 = (uint)(lVar2 / 0x38);
    if (uVar1 < this->m_poolSize) {
      uVar3 = this->m_nextFree - 1;
      this->m_nextFree = uVar3;
      this->m_free[uVar3] = uVar1;
      (**(t->super_Node).super_SignalEmitter._vptr_SignalEmitter)(t,t,lVar2 % 0x38);
      return;
    }
    __assertion = "isAlloctated(t)";
    uVar1 = 0x55;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,uVar1,
                "void rengine::AllocationPool<rengine::OpacityNode>::deallocate(T *) [T = rengine::OpacityNode]"
               );
}

Assistant:

void deallocate(T *t) {
        assert(m_memory);
        assert(m_free);
        assert(m_nextFree > 0);
        assert(isAlloctated(t));

        unsigned pos = t - m_memory;

        --m_nextFree;
        m_free[m_nextFree] = pos;

        // Call the destructor...
        t->~T();
    }